

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::DrawMessages(DBaseStatusBar *this,int layer,int bottom)

{
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 this_00;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar1;
  uint uVar2;
  uint uVar3;
  
  this_00 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)this->Messages[layer].field_0.p;
  if (this_00 != (DHUDMessage *)0x0) {
    if ((*(byte *)((long)this_00 + 0x20) & 0x20) == 0) {
      uVar3 = 0;
      if (automapactive) {
        uVar3 = (uint)viewactive * 2 + 2;
      }
      uVar2 = (uint)viewactive;
      aVar1.p = (((TObjPtr<DHUDMessage> *)&this_00.o[4].Class)->field_0).p;
      do {
        if (aVar1.p == (DHUDMessage *)0x0) {
LAB_004cf8af:
          DHUDMessage::Draw(this_00.p,bottom,uVar3 | uVar2);
          return;
        }
        if ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0) {
          ((this_00.p)->Next).field_0.p = (DHUDMessage *)0x0;
          goto LAB_004cf8af;
        }
        DHUDMessage::Draw(this_00.p,bottom,uVar3 | uVar2);
        this_00 = aVar1;
        aVar1.p = ((aVar1.p)->Next).field_0.p;
      } while( true );
    }
    this->Messages[layer].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)0x0;
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawMessages (int layer, int bottom)
{
	DHUDMessage *msg = Messages[layer];
	int visibility = 0;

	if (viewactive)
	{
		visibility |= HUDMSG_NotWith3DView;
	}
	if (automapactive)
	{
		visibility |= viewactive ? HUDMSG_NotWithOverlayMap : HUDMSG_NotWithFullMap;
	}
	while (msg)
	{
		DHUDMessage *next = msg->Next;
		msg->Draw (bottom, visibility);
		msg = next;
	}
}